

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_text_clamp(nk_user_font *font,char *text,int text_len,float space,int *glyphs,
                 float *text_width,nk_rune *sep_list,int sep_count)

{
  bool bVar1;
  int *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  float *in_R8;
  long in_R9;
  float in_XMM0_Da;
  float fVar2;
  int in_stack_00000008;
  float sep_width;
  int sep_g;
  int sep_len;
  float s;
  int g;
  int len;
  float width;
  nk_rune unicode;
  float last_width;
  int glyph_len;
  int i;
  int local_70;
  int local_68;
  float clen;
  int iVar3;
  uint in_stack_ffffffffffffffa8;
  int iVar4;
  int local_50;
  float local_4c;
  float local_44;
  int local_40;
  int local_3c;
  int local_4;
  
  local_44 = 0.0;
  local_4c = 0.0;
  local_50 = 0;
  iVar4 = 0;
  local_70 = 0;
  iVar3 = 0;
  clen = 0.0;
  if (in_stack_00000008 < 0) {
    local_68 = 0;
  }
  else {
    local_68 = in_stack_00000008;
  }
  in_stack_00000008 = local_68;
  local_40 = nk_utf_decode((char *)(ulong)in_stack_ffffffffffffffa8,(nk_rune *)0x0,0);
  do {
    bVar1 = false;
    if ((local_40 != 0) && (bVar1 = false, local_4c < in_XMM0_Da)) {
      bVar1 = local_50 < in_EDX;
    }
    if (!bVar1) {
      if (local_50 < in_EDX) {
        *in_RCX = iVar3;
        *in_R8 = clen;
        if (local_70 == 0) {
          local_70 = local_50;
        }
        local_4 = local_70;
      }
      else {
        *in_RCX = iVar4;
        *in_R8 = local_44;
        local_4 = local_50;
      }
      return local_4;
    }
    local_50 = local_40 + local_50;
    fVar2 = (float)(*(code *)in_RDI[2])(*(undefined4 *)(in_RDI + 1),*in_RDI,in_RSI,local_50);
    for (local_3c = 0; local_3c < in_stack_00000008; local_3c = local_3c + 1) {
      if (*(int *)(in_R9 + (long)local_3c * 4) == 0) {
        local_44 = local_4c;
        iVar3 = iVar4 + 1;
        clen = local_4c;
        local_70 = local_50;
        break;
      }
    }
    if (local_3c == in_stack_00000008) {
      local_44 = local_4c;
      iVar3 = iVar4 + 1;
      clen = local_4c;
    }
    local_40 = nk_utf_decode((char *)CONCAT44(iVar4,fVar2),(nk_rune *)CONCAT44(local_70,iVar3),
                             (int)clen);
    iVar4 = iVar4 + 1;
    local_4c = fVar2;
  } while( true );
}

Assistant:

NK_LIB int
nk_text_clamp(const struct nk_user_font *font, const char *text,
int text_len, float space, int *glyphs, float *text_width,
nk_rune *sep_list, int sep_count)
{
int i = 0;
int glyph_len = 0;
float last_width = 0;
nk_rune unicode = 0;
float width = 0;
int len = 0;
int g = 0;
float s;

int sep_len = 0;
int sep_g = 0;
float sep_width = 0;
sep_count = NK_MAX(sep_count,0);

glyph_len = nk_utf_decode(text, &unicode, text_len);
while (glyph_len && (width < space) && (len < text_len)) {
len += glyph_len;
s = font->width(font->userdata, font->height, text, len);
for (i = 0; i < sep_count; ++i) {
if (unicode != sep_list[i]) continue;
sep_width = last_width = width;
sep_g = g+1;
sep_len = len;
break;
}
if (i == sep_count){
last_width = sep_width = width;
sep_g = g+1;
}
width = s;
glyph_len = nk_utf_decode(&text[len], &unicode, text_len - len);
g++;
}
if (len >= text_len) {
*glyphs = g;
*text_width = last_width;
return len;
} else {
*glyphs = sep_g;
*text_width = sep_width;
return (!sep_len) ? len: sep_len;
}
}